

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::NSideConnects
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,int side)

{
  int iVar1;
  int **ppiVar2;
  int *piVar3;
  int iVar4;
  int *subSide;
  int *piVar5;
  TPZStack<int,_10> sideClosure;
  TPZManVector<int,_10> local_60;
  
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_60);
  pztopology::TPZQuadrilateral::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_60);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_60,side);
  ppiVar2 = TPZVec<int>::begin(&local_60.super_TPZVec<int>);
  piVar5 = *ppiVar2;
  piVar3 = TPZVec<int>::end(&local_60.super_TPZVec<int>);
  iVar4 = 0;
  for (; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    iVar1 = pztopology::TPZQuadrilateral::SideDimension(*piVar5);
    iVar4 = (iVar4 + 1) - (uint)(iVar1 == 0);
  }
  TPZManVector<int,_10>::~TPZManVector(&local_60);
  return iVar4;
}

Assistant:

int TPZCompElHCurl<TSHAPE>::NSideConnects(int side) const{
#ifdef PZDEBUG
    if(side <0 || side >= TSHAPE::NSides){
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << "Side: " << side <<"unhandled case\n";
        PZError<<sout.str();
#ifdef PZ_LOG
        LOGPZ_ERROR(logger,sout.str())
#endif
    }
#endif
    int nCons = 0;
    TPZStack<int> sideClosure;
    TSHAPE::LowerDimensionSides(side,sideClosure);
    sideClosure.Push(side);
    for(auto &subSide :sideClosure){
        if(TSHAPE::SideDimension(subSide)) nCons++;
    }
    return nCons;
}